

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi_load_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  uchar *puVar1;
  stbi__context s;
  stbi__context local_110;
  
  local_110.img_buffer = local_110.buffer_start;
  local_110.io.eof = stbi__stdio_eof;
  local_110.io.read = stbi__stdio_read;
  local_110.io.skip = stbi__stdio_skip;
  local_110.read_from_callbacks = 1;
  local_110.buflen = 0x80;
  local_110.callback_already_read = 0;
  local_110.io_user_data = f;
  local_110.img_buffer_original = local_110.img_buffer;
  stbi__refill_buffer(&local_110);
  puVar1 = stbi__load_and_postprocess_8bit(&local_110,x,y,comp,req_comp);
  if (puVar1 != (uchar *)0x0) {
    fseek((FILE *)f,(long)((int)local_110.img_buffer - (int)local_110.img_buffer_end),1);
  }
  return puVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}